

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O0

void ecp_clear_precomputed(mbedtls_ecp_group *grp)

{
  ulong local_18;
  size_t i;
  mbedtls_ecp_group *grp_local;
  
  if (grp->T != (mbedtls_ecp_point *)0x0) {
    for (local_18 = 0; local_18 < grp->T_size; local_18 = local_18 + 1) {
      mbedtls_ecp_point_free(grp->T + local_18);
    }
    free(grp->T);
  }
  grp->T = (mbedtls_ecp_point *)0x0;
  grp->T_size = 0;
  return;
}

Assistant:

void ecp_clear_precomputed( mbedtls_ecp_group *grp )
{
    if( grp->T != NULL )
    {
        size_t i;
        for( i = 0; i < grp->T_size; i++ )
            mbedtls_ecp_point_free( &grp->T[i] );
        mbedtls_free( grp->T );
    }
    grp->T = NULL;
    grp->T_size = 0;
}